

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

string * __thiscall
SchemeVector::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemeVector *this)

{
  element_type *peVar1;
  undefined1 local_48 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  SchemeVector *local_18;
  SchemeVector *this_local;
  
  local_18 = this;
  this_local = (SchemeVector *)__return_storage_ptr__;
  to_list((SchemeVector *)local_48);
  peVar1 = std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_48);
  (*(peVar1->super_SchemeObject)._vptr_SchemeObject[2])(local_48 + 0x10);
  std::operator+(__return_storage_ptr__,"#",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_48 + 0x10));
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  std::shared_ptr<SchemePair>::~shared_ptr((shared_ptr<SchemePair> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeVector::external_repr() const
{
    return "#" + to_list()->external_repr();
}